

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_MtDecoder_AssignHasbits(upb_MtDecoder *d)

{
  ushort uVar1;
  upb_MiniTable *puVar2;
  upb_MiniTableField *puVar3;
  size_t sVar4;
  uint16_t local_50;
  upb_MiniTableField *field_1;
  int i_1;
  upb_MiniTableField *field;
  ulong uStack_28;
  int i;
  size_t last_hasbit;
  int n;
  upb_MiniTable *ret;
  upb_MtDecoder *d_local;
  
  puVar2 = d->table;
  uVar1 = puVar2->field_count_dont_copy_me__upb_internal_use_only;
  uStack_28 = 0x3f;
  for (field._4_4_ = 0; field._4_4_ < (int)(uint)uVar1; field._4_4_ = field._4_4_ + 1) {
    puVar3 = puVar2->fields_dont_copy_me__upb_internal_use_only;
    if (puVar3[field._4_4_].offset_dont_copy_me__upb_internal_use_only == 2) {
      uStack_28 = uStack_28 + 1;
      puVar3[field._4_4_].presence = (int16_t)uStack_28;
    }
    else if (puVar3[field._4_4_].offset_dont_copy_me__upb_internal_use_only == 0) {
      puVar3[field._4_4_].presence = 0;
    }
  }
  if (uStack_28 < 0x80) {
    puVar2->required_count_dont_copy_me__upb_internal_use_only = (char)uStack_28 + 0xc1;
    for (field_1._4_4_ = 0; field_1._4_4_ < (int)(uint)uVar1; field_1._4_4_ = field_1._4_4_ + 1) {
      if (puVar2->fields_dont_copy_me__upb_internal_use_only[field_1._4_4_].
          offset_dont_copy_me__upb_internal_use_only == 1) {
        uStack_28 = uStack_28 + 1;
        puVar2->fields_dont_copy_me__upb_internal_use_only[field_1._4_4_].presence =
             (int16_t)uStack_28;
      }
    }
    if (uStack_28 == 0) {
      local_50 = 0;
    }
    else {
      sVar4 = upb_MiniTable_DivideRoundUp(uStack_28 + 1,8);
      local_50 = (uint16_t)sVar4;
    }
    puVar2->size_dont_copy_me__upb_internal_use_only = local_50;
    return;
  }
  upb_MdDecoder_ErrorJmp(&d->base,"Too many required fields");
}

Assistant:

static void upb_MtDecoder_AssignHasbits(upb_MtDecoder* d) {
  upb_MiniTable* ret = d->table;
  int n = ret->UPB_PRIVATE(field_count);
  size_t last_hasbit = kUpb_Reserved_Hasbits - 1;

  // First assign required fields, which must have the lowest hasbits.
  for (int i = 0; i < n; i++) {
    upb_MiniTableField* field =
        (upb_MiniTableField*)&ret->UPB_PRIVATE(fields)[i];
    if (field->UPB_PRIVATE(offset) == kRequiredPresence) {
      field->presence = ++last_hasbit;
    } else if (field->UPB_PRIVATE(offset) == kNoPresence) {
      field->presence = 0;
    }
  }
  if (last_hasbit > kUpb_Reserved_Hasbits + 63) {
    upb_MdDecoder_ErrorJmp(&d->base, "Too many required fields");
  }

  ret->UPB_PRIVATE(required_count) = last_hasbit - (kUpb_Reserved_Hasbits - 1);

  // Next assign non-required hasbit fields.
  for (int i = 0; i < n; i++) {
    upb_MiniTableField* field =
        (upb_MiniTableField*)&ret->UPB_PRIVATE(fields)[i];
    if (field->UPB_PRIVATE(offset) == kHasbitPresence) {
      field->presence = ++last_hasbit;
    }
  }

  ret->UPB_PRIVATE(size) =
      last_hasbit ? upb_MiniTable_DivideRoundUp(last_hasbit + 1, 8) : 0;
}